

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imagelist.cc
# Opt level: O0

shared_ptr<const_rcg::Image> __thiscall rcg::ImageList::find(ImageList *this,uint64_t timestamp)

{
  shared_ptr<const_rcg::Image> *psVar1;
  element_type *this_00;
  uint64_t uVar2;
  uint64_t in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  long in_RSI;
  element_type *in_RDI;
  shared_ptr<const_rcg::Image> sVar4;
  size_t i;
  shared_ptr<const_rcg::Image> *in_stack_ffffffffffffffb8;
  shared_ptr<const_rcg::Image> *this_01;
  shared_ptr<const_rcg::Image> *local_20;
  
  local_20 = (shared_ptr<const_rcg::Image> *)0x0;
  do {
    this_01 = local_20;
    psVar1 = (shared_ptr<const_rcg::Image> *)
             std::
             vector<std::shared_ptr<const_rcg::Image>,_std::allocator<std::shared_ptr<const_rcg::Image>_>_>
             ::size((vector<std::shared_ptr<const_rcg::Image>,_std::allocator<std::shared_ptr<const_rcg::Image>_>_>
                     *)(in_RSI + 8));
    if (psVar1 <= this_01) {
      std::shared_ptr<const_rcg::Image>::shared_ptr((shared_ptr<const_rcg::Image> *)0x1376e3);
      _Var3._M_pi = extraout_RDX_00;
LAB_001376e3:
      sVar4.super___shared_ptr<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           _Var3._M_pi;
      sVar4.super___shared_ptr<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
      return (shared_ptr<const_rcg::Image>)
             sVar4.super___shared_ptr<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2>;
    }
    std::
    vector<std::shared_ptr<const_rcg::Image>,_std::allocator<std::shared_ptr<const_rcg::Image>_>_>::
    operator[]((vector<std::shared_ptr<const_rcg::Image>,_std::allocator<std::shared_ptr<const_rcg::Image>_>_>
                *)(in_RSI + 8),(size_type)local_20);
    this_00 = std::__shared_ptr_access<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x137693);
    uVar2 = Image::getTimestampNS(this_00);
    if (uVar2 == in_RDX) {
      std::
      vector<std::shared_ptr<const_rcg::Image>,_std::allocator<std::shared_ptr<const_rcg::Image>_>_>
      ::operator[]((vector<std::shared_ptr<const_rcg::Image>,_std::allocator<std::shared_ptr<const_rcg::Image>_>_>
                    *)(in_RSI + 8),(size_type)local_20);
      std::shared_ptr<const_rcg::Image>::shared_ptr(this_01,in_stack_ffffffffffffffb8);
      _Var3._M_pi = extraout_RDX;
      goto LAB_001376e3;
    }
    local_20 = (shared_ptr<const_rcg::Image> *)
               ((long)&(local_20->super___shared_ptr<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr + 1);
  } while( true );
}

Assistant:

std::shared_ptr<const Image> ImageList::find(uint64_t timestamp) const
{
  for (size_t i=0; i<list.size(); i++)
  {
    if (list[i]->getTimestampNS() == timestamp)
    {
      return list[i];
    }
  }

  return std::shared_ptr<const Image>();
}